

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

bool btGjkEpaSolver2::Distance
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results)

{
  undefined1 auVar1 [16];
  _ _Var2;
  code *pcVar3;
  long *plVar4;
  U i;
  ulong uVar5;
  btScalar bVar6;
  undefined8 uVar7;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM1_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  btVector3 bVar11;
  tShape shape;
  GJK gjk;
  btVector3 local_308;
  btVector3 local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  btVector3 local_2c8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  tShape local_290;
  GJK local_200;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_290,false);
  local_200.m_nfree = 0;
  local_200.m_current = 0;
  local_200.m_ray.m_floats[0] = 0.0;
  local_200.m_ray.m_floats[1] = 0.0;
  local_200.m_ray.m_floats[2] = 0.0;
  local_200.m_ray.m_floats[3] = 0.0;
  local_200.m_status = Failed;
  local_200.m_distance = 0.0;
  _Var2 = gjkepa2_impl::GJK::Evaluate(&local_200,&local_290,guess);
  if (_Var2 == Valid) {
    local_2f8.m_floats[0] = 0.0;
    local_2f8.m_floats[1] = 0.0;
    local_2f8.m_floats[2] = 0.0;
    local_2f8.m_floats[3] = 0.0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_308.m_floats[0] = 0.0;
    local_308.m_floats[1] = 0.0;
    local_308.m_floats[2] = 0.0;
    local_308.m_floats[3] = 0.0;
    fVar10 = 0.0;
    fVar8 = 0.0;
    fVar9 = 0.0;
    for (uVar5 = 0; bVar6 = local_308.m_floats[2], uVar5 < (local_200.m_simplex)->rank;
        uVar5 = uVar5 + 1) {
      plVar4 = (long *)((long)&(local_290.m_shapes[0]->super_btCollisionShape).
                               _vptr_btCollisionShape + local_290._136_8_);
      pcVar3 = (code *)local_290.Ls;
      if ((local_290.Ls & 1) != 0) {
        pcVar3 = *(code **)(local_290.Ls + *plVar4 + -1);
      }
      local_2d8 = ZEXT416((uint)(local_200.m_simplex)->p[uVar5]);
      local_2a8 = local_308.m_floats[0];
      fStack_2a4 = local_308.m_floats[1];
      fStack_2a0 = fVar8;
      fStack_29c = fVar9;
      uVar7 = (*pcVar3)(plVar4,(local_200.m_simplex)->c[uVar5]);
      fVar10 = fVar10 + extraout_XMM1_Da * (float)local_2d8._0_4_;
      local_2b8 = (float)local_2d8._0_4_;
      fStack_2b4 = (float)local_2d8._0_4_;
      fStack_2b0 = (float)local_2d8._0_4_;
      fStack_2ac = (float)local_2d8._0_4_;
      local_2f8.m_floats[0] = (float)local_2e8 + (float)uVar7 * (float)local_2d8._0_4_;
      local_2f8.m_floats[1] =
           local_2e8._4_4_ + (float)((ulong)uVar7 >> 0x20) * (float)local_2d8._0_4_;
      local_2e8 = CONCAT44(local_2f8.m_floats[1],local_2f8.m_floats[0]);
      uStack_2e0 = CONCAT44(uStack_2e0._4_4_ + extraout_XMM0_Dd * (float)local_2d8._0_4_,
                            (float)uStack_2e0 + extraout_XMM0_Dc * (float)local_2d8._0_4_);
      local_2f8.m_floats[2] = fVar10;
      local_2c8 = operator-(&(local_200.m_simplex)->c[uVar5]->d);
      bVar11 = gjkepa2_impl::MinkowskiDiff::Support1(&local_290,&local_2c8);
      local_308.m_floats[2] = bVar6 + bVar11.m_floats[2] * (float)local_2d8._0_4_;
      local_308.m_floats[0] = local_2a8 + bVar11.m_floats[0] * local_2b8;
      local_308.m_floats[1] = fStack_2a4 + bVar11.m_floats[1] * fStack_2b4;
      fVar8 = fStack_2a0 + extraout_XMM0_Dc_00 * fStack_2b0;
      fVar9 = fStack_29c + extraout_XMM0_Dd_00 * fStack_2ac;
    }
    bVar11 = btTransform::operator()(wtrs0,&local_2f8);
    *&results->witnesses[0].m_floats = bVar11.m_floats;
    bVar11 = btTransform::operator()(wtrs0,&local_308);
    *&results->witnesses[1].m_floats = bVar11.m_floats;
    auVar1._4_4_ = local_2f8.m_floats[1] - local_308.m_floats[1];
    auVar1._0_4_ = local_2f8.m_floats[0] - local_308.m_floats[0];
    auVar1._8_4_ = local_2f8.m_floats[2] - local_308.m_floats[2];
    auVar1._12_4_ = 0;
    *(undefined1 (*) [16])(results->normal).m_floats = auVar1;
    bVar6 = btVector3::length(&results->normal);
    results->distance = bVar6;
    local_2c8.m_floats[0] =
         (btScalar)(~-(uint)(0.0001 < bVar6) & 0x3f800000 | (uint)bVar6 & -(uint)(0.0001 < bVar6));
    btVector3::operator/=(&results->normal,local_2c8.m_floats);
  }
  else {
    results->status = (_Var2 != Inside) + Penetrating;
  }
  return _Var2 == Valid;
}

Assistant:

bool		btGjkEpaSolver2::Distance(	const btConvexShape*	shape0,
									  const btTransform&		wtrs0,
									  const btConvexShape*	shape1,
									  const btTransform&		wtrs1,
									  const btVector3&		guess,
									  sResults&				results)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,false);
	GJK				gjk;
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,guess);
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		results.normal			=	w0-w1;
		results.distance		=	results.normal.length();
		results.normal			/=	results.distance>GJK_MIN_DISTANCE?results.distance:1;
		return(true);
	}
	else
	{
		results.status	=	gjk_status==GJK::eStatus::Inside?
			sResults::Penetrating	:
		sResults::GJK_Failed	;
		return(false);
	}
}